

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall t_rb_generator::generate_service_helpers(t_rb_generator *this,t_service *tservice)

{
  t_rb_ofstream *out;
  ostream *poVar1;
  int iVar2;
  pointer pptVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  vector<t_function_*,_std::allocator<t_function_*>_> local_38;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_38,&tservice->functions_);
  out = &this->f_service_;
  if (0 < *(int *)&(this->f_service_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)&(this->f_service_).super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"# HELPER FUNCTIONS AND STRUCTURES",0x21);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar3 = local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      generate_rb_struct(this,out,(*pptVar3)->arglist_,false);
      generate_rb_function_helpers(this,*pptVar3);
      pptVar3 = pptVar3 + 1;
    } while (pptVar3 !=
             local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_rb_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_.indent() << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_rb_struct(f_service_, ts);
    generate_rb_function_helpers(*f_iter);
  }
}